

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Request.cpp
# Opt level: O1

int __thiscall MNS::Request::Parse(Request *this,ssize_t requestLen)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  void *pvVar8;
  size_t sVar9;
  mapped_type *pmVar10;
  long lVar11;
  byte bVar12;
  uint uVar13;
  ulong uVar14;
  int local_54;
  key_type local_50;
  
  if (-1 < requestLen) {
    this->finished = false;
    this->lastParsePos = 0;
    this->bufferLen = requestLen;
  }
  this->state = PARSING_HEADERS;
  uVar14 = this->lastParsePos;
  lVar7 = this->bufferLen;
  lVar11 = (long)(int)uVar14;
  if (lVar11 < lVar7) {
    uVar5 = 0;
    do {
      uVar13 = (uint)uVar14;
      if (4 < uVar5) {
        this->finished = true;
        bVar4 = true;
        uVar13 = (uint)lVar7;
        goto switchD_0010975f_caseD_45;
      }
      pcVar2 = this->buffer;
      pcVar1 = pcVar2 + lVar11;
      bVar12 = pcVar2[lVar11];
      switch(uVar5) {
      case 0:
        uVar5 = 1;
        bVar4 = true;
        switch(bVar12 & 0xdf) {
        case 0x43:
          this->method = CONNECT;
          goto LAB_00109a17;
        case 0x44:
          this->method = DELETE;
          uVar13 = uVar13 + 6;
          break;
        case 0x45:
        case 0x46:
        case 0x49:
        case 0x4a:
        case 0x4b:
        case 0x4c:
        case 0x4d:
        case 0x4e:
          break;
        case 0x47:
          this->method = GET;
          goto LAB_00109a4a;
        case 0x48:
          this->method = HEAD;
LAB_001099fd:
          uVar13 = uVar13 + 4;
          break;
        case 0x4f:
          this->method = OPTIONS;
LAB_00109a17:
          uVar13 = uVar13 + 7;
          break;
        case 0x50:
          if ((pcVar1[1] & 0xdfU) != 0x55) {
            if ((pcVar1[1] & 0xdfU) != 0x4f) {
              this->method = PATCH;
              goto LAB_00109a5a;
            }
            this->method = POST;
            goto LAB_001099fd;
          }
          this->method = PUT;
LAB_00109a4a:
          uVar13 = uVar13 + 3;
          break;
        default:
          if ((bVar12 & 0xdf) == 0x54) {
            this->method = TRACE;
LAB_00109a5a:
            uVar13 = uVar13 + 5;
          }
        }
        break;
      case 1:
        this->url = pcVar1;
        pvVar8 = memchr(pcVar1,0x20,lVar7 - lVar11);
        if (pvVar8 != (void *)0x0) {
          iVar6 = (int)pvVar8 - (int)pcVar2;
          pcVar2[iVar6] = '\0';
          uVar13 = iVar6 + 7;
          uVar5 = 2;
          goto LAB_0010999f;
        }
        this->state = NEED_MORE_DATA;
        uVar5 = 1;
        bVar4 = false;
        local_54 = 1;
        break;
      case 2:
        if (bVar12 == 0x30) {
          this->httpVersion = HTTP_1_0;
        }
        else if (bVar12 == 0x31) {
          this->httpVersion = HTTP_1_1;
        }
        uVar13 = uVar13 + 2;
        uVar5 = 3;
        goto LAB_0010999f;
      case 3:
        if (bVar12 != 0x3a) {
          lVar7 = (long)(int)uVar13;
          do {
            if ('@' < (char)bVar12) {
              this->buffer[lVar7] = this->buffer[lVar7] | 0x20;
            }
            bVar12 = this->buffer[lVar7 + 1];
            lVar7 = lVar7 + 1;
            uVar13 = (int)uVar14 + 1;
            uVar14 = (ulong)uVar13;
          } while (bVar12 != 0x3a);
        }
        this->buffer[(int)uVar13] = '\0';
        pcVar3 = this->buffer;
        uVar13 = (pcVar3[(long)(int)uVar13 + 1] == ' ') + 1 + uVar13;
        pcVar2 = pcVar3 + (int)uVar13;
        pvVar8 = memchr(pcVar2,0xd,this->bufferLen - (long)(int)uVar13);
        if (pvVar8 == (void *)0x0) {
          this->state = NEED_MORE_DATA;
          local_54 = 1;
          uVar5 = 3;
          bVar4 = false;
        }
        else {
          iVar6 = (int)((long)pvVar8 - (long)pcVar3);
          pcVar3[iVar6] = '\0';
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          sVar9 = strlen(pcVar1);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar1,pcVar1 + sVar9)
          ;
          pmVar10 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&this->headers,&local_50);
          pcVar1 = (char *)pmVar10->_M_string_length;
          strlen(pcVar2);
          std::__cxx11::string::_M_replace((ulong)pmVar10,0,pcVar1,(ulong)pcVar2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          uVar13 = iVar6 + 1;
          lVar7 = (long)pvVar8 - (long)pcVar3 << 0x20;
          uVar5 = 3;
          bVar4 = true;
          if ((this->buffer[lVar7 + 0x200000000 >> 0x20] == '\r') &&
             (this->buffer[lVar7 + 0x300000000 >> 0x20] == '\n')) {
            lVar7 = lVar7 + 0x400000000 >> 0x20;
            if ((this->method & ~OPTIONS) == GET) {
              if (lVar7 < this->bufferLen) {
                this->lastParsePos = lVar7;
              }
              else {
LAB_00109a2b:
                this->finished = true;
                uVar5 = 5;
              }
              bVar4 = false;
              local_54 = 0;
            }
            else {
              uVar5 = 4;
              if (this->bufferLen <= lVar7) goto LAB_00109a2b;
            }
          }
        }
        break;
      case 4:
        lVar11 = (long)(int)uVar13;
        uVar13 = uVar13 + 2;
        this->bodyBuffer = pcVar2 + lVar11 + 2;
        this->bodyBufferLen = lVar7 - (lVar11 + 2);
        uVar5 = 5;
LAB_0010999f:
        bVar4 = true;
      }
switchD_0010975f_caseD_45:
      if (!bVar4) {
        return local_54;
      }
      uVar14 = (ulong)(uVar13 + 1);
      lVar11 = (long)(int)(uVar13 + 1);
      lVar7 = this->bufferLen;
    } while (lVar11 < lVar7);
  }
  return 0;
}

Assistant:

int MNS::Request::Parse(ssize_t requestLen) {
	if(requestLen >= 0) {
		this->finished = false;
		this->lastParsePos = 0;
		this->bufferLen = requestLen;
	}

	char *tailPos = NULL;
	this->state = REQUEST_STATE::PARSING_HEADERS;
	
	PARSER_STATE parserState = PARSER_STATE::METHOD;

	for (int i = this->lastParsePos; i < this->bufferLen; i++) {
		char c = this->buffer[i];

		switch (parserState) {
			case PARSER_STATE::METHOD:
				if (c == 'G' || c == 'g') {
					this->method = HTTP_METHOD::GET;
					i += 3;
				} else if (c == 'O' || c == 'o') {
					this->method = HTTP_METHOD::OPTIONS;
					i += 7;
				} else if (c == 'P' || c == 'p') {
					char c1 = this->buffer[i + 1];
					if (c1 == 'O' || c1 == 'o') {
						this->method = HTTP_METHOD::POST;
						i += 4;
					} else if (c1 == 'U' || c1 == 'u') {
						this->method = HTTP_METHOD::PUT;
						i += 3;
					} else {
						this->method = HTTP_METHOD::PATCH;
						i += 5;
						// Todo: This may be unsafe and offset should be found
					}
				} else if (c == 'H' || c == 'h') {
					this->method = HTTP_METHOD::HEAD;
					i += 4;
				} else if (c == 'D' || c == 'd') {
					this->method = HTTP_METHOD::DELETE;
					i += 6;
				} else if (c == 'C' || c == 'c') {
					this->method = HTTP_METHOD::CONNECT;
					i += 7;
				} else if (c == 'T' || c == 't') {
					this->method = HTTP_METHOD::TRACE;
					i += 5;
				}

				parserState = PARSER_STATE::URL;
				break;
			case PARSER_STATE::URL:
				this->url = this->buffer + i;
				tailPos = (char*)memchr(this->url, ' ', this->bufferLen - i);
				if(tailPos == NULL) { // ERROR, TRY AND GET MROE DATA
					this->state = REQUEST_STATE::NEED_MORE_DATA;

					return 1;
				}
				i = (int)(tailPos - this->buffer);
				buffer[i] = '\0';

				i += 7;
				parserState = PARSER_STATE::HTTP_VERSION;
				break;
			case PARSER_STATE::HTTP_VERSION:
				if (c == '1') this->httpVersion = HTTP_VERSION::HTTP_1_1;
				else if (c == '0') this->httpVersion = HTTP_VERSION::HTTP_1_0;
				parserState = PARSER_STATE::HEADER_NAME;
				i += 2;
				break;
			case PARSER_STATE::HEADER_NAME: {
				char *name = buffer + i;
				while (c != ':') {
					if (c >= 'A') buffer[i] |= 0x20;//-= 'A' - 'a';

					c = buffer[++i];
				}

				buffer[i] = '\0';
				i += (buffer[i + 1] == ' '?2:1);

				char *value = buffer + i;
				tailPos = (char *)memchr(buffer+i, '\r', this->bufferLen - i);
				if(tailPos == NULL) { // ERROR, TRY AND GET MORE DATA
					this->state = REQUEST_STATE::NEED_MORE_DATA;

					return 1;
				} else {
					i = (int) (tailPos - buffer);
					buffer[i++] = '\0';
				}

				//this->headers[std::string(name, nameLen)] = std::string(value, valueLen);
				this->headers[name] = value;

				// Finished parsing headers
				if (buffer[i + 1] == '\r' && buffer[i + 2] == '\n') {
					// Possibility of pipelining
					if(this->method == HTTP_METHOD::GET || this->method == HTTP_METHOD::HEAD) {
						// More pipelined requests
						if(i + 3 < this->bufferLen) {
							this->lastParsePos = i+3;

							// Return back to handler
							return 0;
						} else {
							parserState = PARSER_STATE::FINISHED;
							this->finished = true;

							return 0;
						}
					} else {
						// Is request not drained
						if(i + 3 < this->bufferLen) {
							parserState = PARSER_STATE::BODY;
						} else {
							parserState = PARSER_STATE::FINISHED;
							this->finished = true;

							return 0;
						}
					}
				}

				break;
			}
			case PARSER_STATE::BODY:
				i += 2;
				// TODO: Copy the body into the message buffer to send to onData event
				this->bodyBuffer = buffer + i;
				this->bodyBufferLen = this->bufferLen - i;
				parserState = PARSER_STATE::FINISHED;
				break;
			default:
				i = this->bufferLen;
				this->finished = true;
				break;
		}
	}

	return 0;
}